

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_flush_page_by_mmuidx_async_0(CPUState *cpu,target_ulong_conflict addr,uint16_t idxmap)

{
  CPUArchState_conflict30 *env;
  _Bool _Var1;
  int64_t now;
  undefined6 in_register_00000012;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  uint mmu_idx;
  long lVar3;
  void **ppvVar4;
  uint32_t *puVar5;
  
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  puVar5 = env[-3].gpr_a + 0xe;
  ppvVar4 = env[-1].irq + 4;
  uVar2 = CONCAT62(in_register_00000012,idxmap);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    mmu_idx = (uint)lVar3;
    if (((uint)CONCAT62(in_register_00000012,idxmap) >> (mmu_idx & 0x1f) & 1) != 0) {
      if ((puVar5[-5] & addr) == puVar5[-6]) {
        now = get_clock_realtime();
        tlb_flush_one_mmuidx_locked(env,mmu_idx,now);
        uVar2 = extraout_RDX;
      }
      else {
        _Var1 = tlb_flush_entry_locked
                          ((uc_struct_conflict15 *)
                           ((ulong)((*(uint *)(ppvVar4 + -1) >> 6 & addr >> 0xe) << 6) +
                           (long)*ppvVar4),(CPUTLBEntry *)(ulong)addr,(target_ulong_conflict)uVar2);
        if (_Var1) {
          *(long *)puVar5 = *(long *)puVar5 + -1;
        }
        tlb_flush_vtlb_page_locked(env,mmu_idx,addr);
        uVar2 = extraout_RDX_00;
      }
    }
    puVar5 = puVar5 + 0xac;
    ppvVar4 = ppvVar4 + 2;
  }
  tb_flush_jmp_cache_tricore(cpu,addr);
  return;
}

Assistant:

static void tlb_flush_page_by_mmuidx_async_0(CPUState *cpu,
                                             target_ulong addr,
                                             uint16_t idxmap)
{
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        if ((idxmap >> mmu_idx) & 1) {
            tlb_flush_page_locked(env, mmu_idx, addr);
        }
    }

    tb_flush_jmp_cache(cpu, addr);
}